

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O2

void on_pipe_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (nread < 1) {
    pcVar3 = "nread > 0";
    uVar2 = 0xa7;
  }
  else {
    pcVar3 = buf->base;
    iVar1 = bcmp("hello world\n",pcVar3,nread);
    if (iVar1 == 0) {
      on_pipe_read_called = on_pipe_read_called + 1;
      free(pcVar3);
      uv_close((uv_handle_t *)&stdin_pipe,close_cb);
      uv_close((uv_handle_t *)&stdout_pipe,close_cb);
      return;
    }
    pcVar3 = "memcmp(\"hello world\\n\", buf->base, nread) == 0";
    uVar2 = 0xa8;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void on_pipe_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  ASSERT(nread > 0);
  ASSERT(memcmp("hello world\n", buf->base, nread) == 0);
  on_pipe_read_called++;

  free(buf->base);

  uv_close((uv_handle_t*)&stdin_pipe, close_cb);
  uv_close((uv_handle_t*)&stdout_pipe, close_cb);
}